

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbdrec_primaldual_tvl1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  LBDOperator *LBD;
  ostream *poVar4;
  char **ppcVar5;
  uint local_3f0;
  int local_3ec;
  float local_3e8;
  int interactive;
  int process_only_fast;
  allocator local_3d9;
  float local_3d8;
  int local_3d4;
  int local_3d0;
  int optionIndex;
  undefined4 local_3c8 [2];
  Mat *local_3c0;
  undefined8 local_3b8;
  _Vector_base<int,_std::allocator<int>_> local_3a8;
  string filename;
  Size local_370;
  Point local_368;
  Size local_360;
  int local_358;
  int local_354;
  _InputArray local_350;
  Mat result;
  Mat testImagef;
  Mat testImage;
  long local_268;
  Mat res8;
  stringstream windowNameStr;
  undefined8 local_1a8 [47];
  
  if (argc < 2) {
    print_usage(_stdout,argv);
    iVar3 = 0;
  }
  else {
    process_only_fast = 0;
    interactive = 0;
    if ((main::long_options == '\0') &&
       (iVar3 = __cxa_guard_acquire(&main::long_options), iVar3 != 0)) {
      main::long_options[0].name = "lbd";
      main::long_options[0].has_arg = 1;
      main::long_options[0].flag = (int *)0x0;
      main::long_options[0].val = 0;
      main::long_options[1].name = "fast";
      main::long_options[1].has_arg = 0;
      main::long_options[1].flag = &process_only_fast;
      main::long_options[2].name = "interactive";
      main::long_options[2].has_arg = 0;
      main::long_options[2].flag = &interactive;
      main::long_options[3].name = "norm";
      main::long_options[3].flag = (int *)0x0;
      main::long_options[3].val = 0;
      main::long_options[4].name = (char *)0x0;
      main::long_options[4].has_arg = 0;
      main::long_options[4]._12_4_ = 0;
      main::long_options[4].flag = (int *)0x0;
      main::long_options[4].val = 0;
      main::long_options[4]._28_4_ = 0;
      main::long_options[1].val = main::long_options[0].has_arg;
      main::long_options[2].val = main::long_options[0].has_arg;
      main::long_options[3].has_arg = main::long_options[0].has_arg;
      __cxa_guard_release(&main::long_options);
    }
    local_3d8 = 10.0;
    local_3e8 = 0.1;
    local_3ec = 1000;
    local_3d0 = 0x20;
    local_3f0 = 0;
    local_3d4 = 0;
switchD_00104a91_caseD_6a:
    do {
      iVar3 = getopt_long(argc,argv,"i:l:o:p:",main::long_options,&optionIndex);
      __s1 = _optarg;
      switch(iVar3) {
      case 0x69:
        local_3ec = atoi(_optarg);
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
        goto switchD_00104a91_caseD_6a;
      case 0x6c:
        dVar1 = atof(_optarg);
        local_3e8 = (float)dVar1;
        goto switchD_00104a91_caseD_6a;
      case 0x6f:
        local_3d4 = atoi(_optarg);
        goto switchD_00104a91_caseD_6a;
      case 0x70:
        local_3d0 = atoi(_optarg);
        local_3d0 = local_3d0 % 2 + local_3d0;
        goto switchD_00104a91_caseD_6a;
      }
      if (iVar3 == 0) {
        if (optionIndex == 3) {
          dVar1 = atof(_optarg);
          local_3d8 = (float)dVar1;
        }
        else if (optionIndex == 0) {
          iVar3 = strncmp(_optarg,"freak",5);
          local_3f0 = 0;
          if (iVar3 != 0) {
            iVar3 = strncmp(__s1,"brief",5);
            local_3f0 = 2;
            if (iVar3 != 0) {
              iVar3 = strncmp(__s1,"exfreak",7);
              local_3f0 = (uint)(iVar3 == 0) * 2 + 1;
            }
          }
        }
        goto switchD_00104a91_caseD_6a;
      }
      if (iVar3 == 0x3f) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown option: -");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3f);
        std::operator<<(poVar4," (ignored)\n");
        goto switchD_00104a91_caseD_6a;
      }
    } while (iVar3 != -1);
    ppcVar5 = argv + ((ulong)(uint)argc - 2);
    if (interactive != 0) {
      ppcVar5 = argv + ((ulong)(uint)argc - 1);
    }
    std::__cxx11::string::string((string *)&filename,*ppcVar5,(allocator *)&windowNameStr);
    cv::imread((string *)&testImage,(int)&filename);
    if (local_268 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error opening image: ");
      poVar4 = std::operator<<(poVar4,(string *)&filename);
      std::endl<char,std::char_traits<char>>(poVar4);
      print_usage(_stderr,argv);
      iVar3 = 1;
    }
    else {
      cv::Mat::Mat(&testImagef);
      local_1a8[0] = 0;
      _windowNameStr = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&testImage,(int)&windowNameStr,0.00392156862745098,0.0);
      iVar2 = local_3d0;
      iVar3 = local_3d4;
      if (local_3d4 == 0) {
        iVar3 = local_3d0;
      }
      LBD = lts2::CreateLbdOperator(local_3f0,0x200);
      local_358 = iVar2;
      local_354 = iVar2;
      (*(LBD->super_LinearOperator)._vptr_LinearOperator[5])(LBD);
      (LBD->super_LinearOperator)._norm = local_3d8;
      cv::Mat::Mat(&result);
      if (process_only_fast == 0) {
        local_360.width = iVar2;
        local_360.height = iVar2;
        local_368.x = iVar3;
        local_368.y = iVar3;
        lts2::PerformTVL1OnImage
                  (&testImagef,&local_360,&local_368,LBD,&result,local_3ec,local_3e8,0.5);
      }
      else {
        local_370.width = iVar2;
        local_370.height = iVar2;
        lts2::PerformTVL1OnImageFAST(&testImagef,&local_370,LBD,&result,local_3ec,local_3e8,0.5);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&windowNameStr);
      poVar4 = std::operator<<((ostream *)local_1a8,"Primal-Dual (TVL1)");
      std::operator<<(poVar4," ");
      if (process_only_fast != 0) {
        poVar4 = std::operator<<((ostream *)local_1a8,"FAST ");
        std::operator<<(poVar4," ");
      }
      std::operator<<((ostream *)local_1a8,
                      &DAT_00112040 + *(int *)(&DAT_00112040 + (ulong)local_3f0 * 4));
      cv::Mat::Mat(&res8);
      local_3b8 = 0;
      local_3c8[0] = 0x2010000;
      local_3c0 = &res8;
      cv::Mat::convertTo((_OutputArray *)&result,(int)local_3c8,255.0,0.0);
      local_350.obj = &res8;
      if (interactive < 1) {
        std::__cxx11::string::string((string *)local_3c8,argv[(ulong)(uint)argc - 1],&local_3d9);
        local_350.sz.width = 0;
        local_350.sz.height = 0;
        local_350.flags = 0x1010000;
        local_3a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cv::imwrite((string *)local_3c8,&local_350,(vector *)&local_3a8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3a8);
        std::__cxx11::string::~string((string *)local_3c8);
      }
      else {
        std::__cxx11::stringbuf::str();
        local_350.sz.width = 0;
        local_350.sz.height = 0;
        local_350.flags = 0x1010000;
        cv::imshow((string *)local_3c8,&local_350);
        std::__cxx11::string::~string((string *)local_3c8);
        cv::waitKey(0);
      }
      cv::Mat::~Mat(&res8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&windowNameStr);
      cv::Mat::~Mat(&result);
      cv::Mat::~Mat(&testImagef);
      iVar3 = 0;
    }
    cv::Mat::~Mat(&testImage);
    std::__cxx11::string::~string((string *)&filename);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 2)
  {
    print_usage(stdout, argv);
    return 0;
  }

  int lbdType = 0;
  int pside = 32;
  int iterations = 1000;
  float lambda = 0.1;
  int offset = 0;
  int process_only_fast = 0;
  int interactive = 0;
  float operator_norm = 10.0;

  static struct option long_options[] = {
    {"lbd", required_argument, 0, 0},
    {"fast", no_argument, &process_only_fast, 1},
    {"interactive", no_argument, &interactive, 1},
    {"norm", required_argument, 0, 0},
    {0, 0, 0, 0}
  };

  int optionIndex;
  int c = getopt_long(argc, argv, "i:l:o:p:", long_options, &optionIndex);
  
  while (c != -1)
  {
    switch (c)
    {
    case 0:
      if (optionIndex == 0)
      {
        if (strncmp(optarg, "freak", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeFreak;
        else if (strncmp(optarg, "brief", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
        else if (strncmp(optarg, "exfreak", 7) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeExFreak;
        else lbdType = (int)lbd::LBD_TYPE::eTypeRandomFreak;
      }
      if (optionIndex == 3)
      {
        operator_norm = (float)atof(optarg);
      }
      break;
      
    case 'i':
      iterations = atoi(optarg);
      break;

    case 'l':
      lambda = (float)atof(optarg);
      break;

    case 'p':
      pside = atoi(optarg);
      pside += (pside % 2);   // Enforce even size
      break;

    case 'o':
      offset = atoi(optarg);
      break;

    case '?':
      std::cerr << "Unknown option: -" << c << " (ignored)\n";
      break;

    default:
      break;
    }

    c = getopt_long(argc, argv, "i:l:o:p:", long_options, &optionIndex);
  }

  std::string filename = (interactive == 0 ? argv[argc-2] : argv[argc-1]);
  cv::Mat testImage = cv::imread(filename, 0);
  if (!testImage.data)
  {
    std::cerr << "Error opening image: " << filename << std::endl;
    print_usage(stderr, argv);
    return EXIT_FAILURE;
  }

  cv::Mat testImagef;
  testImage.convertTo(testImagef, CV_32F, 1.0/255.0);

  cv::Size patchSize(pside,pside);
  if (offset == 0) offset = pside;
  cv::Point patchOffset(offset,offset);

  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType);
  LBD->initWithPatchSize(patchSize);
  LBD->setNorm(operator_norm);

  cv::Mat result;

  if (process_only_fast == 0)
    lts2::PerformTVL1OnImage(testImagef, patchSize, patchOffset, *LBD, result, iterations, lambda);
  else
    lts2::PerformTVL1OnImageFAST(testImagef, patchSize, *LBD, result, iterations, lambda);

  std::stringstream windowNameStr;
  windowNameStr << "Primal-Dual (TVL1)" << " ";
  if (process_only_fast != 0)
    windowNameStr << "FAST " << " ";

  switch (lbdType)
  {
  case (int)lbd::LBD_TYPE::eTypeFreak:
    windowNameStr << "FREAK";
    break;

  case (int)lbd::LBD_TYPE::eTypeRandomFreak:
    windowNameStr << "Randomized FREAK";
    break;

  case (int)lbd::LBD_TYPE::eTypeBrief:
    windowNameStr << "BRIEF";
    break;

  case (int)lbd::LBD_TYPE::eTypeExFreak:
    windowNameStr << "Ex-FREAK";
    break;
  }

  cv::Mat res8;
  result.convertTo(res8, CV_8U, 255.0);

  if (interactive > 0)
  {
    cv::imshow(windowNameStr.str(), res8);
    cv::waitKey();
  }
  else cv::imwrite(argv[argc-1], res8);

  return EXIT_SUCCESS;
}